

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BlockCoverageEventSyntax *pBVar1;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Token *args_3;
  
  args_3 = (Token *)__child_stack;
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::BlockEventExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::BlockEventExpressionSyntax_*> *)0x7b0dc0);
  deepClone<slang::syntax::BlockEventExpressionSyntax>
            ((BlockEventExpressionSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BlockCoverageEventSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::BlockEventExpressionSyntax&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (BlockEventExpressionSyntax *)__fn,args_3);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BlockCoverageEventSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BlockCoverageEventSyntax>(
        node.atat.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<BlockEventExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc)
    );
}